

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O0

void __thiscall kratos::ActiveVisitor::visit(ActiveVisitor *this,SequentialStmtBlock *stmt)

{
  EventEdgeType EVar1;
  initializer_list<const_kratos::IRNode_*> __l;
  initializer_list<const_kratos::IRNode_*> __l_00;
  initializer_list<const_kratos::IRNode_*> __l_01;
  bool bVar2;
  byte bVar3;
  VarType VVar4;
  PortType PVar5;
  vector<kratos::EventControl,_std::allocator<kratos::EventControl>_> *this_00;
  reference pEVar6;
  bool *pbVar7;
  mapped_type *pmVar8;
  VarException *pVVar9;
  _Node_iterator_base<std::pair<kratos::Port_*const,_bool>,_false> in_RCX;
  char (*format_str) [43];
  char (*format_str_00) [55];
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  pair<kratos::Port_*,_bool> pVar10;
  pair<std::__detail::_Node_iterator<std::pair<kratos::Port_*const,_bool>,_false,_false>,_bool>
  pVar11;
  pair<kratos::Port_*,_kratos::SequentialStmtBlock_*> pVar12;
  format_args args;
  format_args args_00;
  format_args args_01;
  string_view format_str_01;
  string_view format_str_02;
  string_view format_str_03;
  allocator<const_kratos::IRNode_*> local_411;
  Port *local_410;
  vector<kratos::EventControl,_std::allocator<kratos::EventControl>_> *local_408;
  Port **local_400;
  size_type local_3f8;
  vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> local_3f0;
  v7 local_3d8 [32];
  string local_3b8;
  _Node_iterator_base<std::pair<kratos::Port_*const,_bool>,_false> local_398;
  undefined1 local_390;
  pair<kratos::Port_*,_kratos::SequentialStmtBlock_*> local_388;
  _Node_iterator_base<std::pair<kratos::Port_*const,_bool>,_false> local_378;
  undefined1 local_370;
  Port *local_368;
  undefined1 local_360;
  pair<kratos::Port_*,_bool> local_358;
  undefined1 local_342;
  allocator<const_kratos::IRNode_*> local_341;
  Port *local_340;
  vector<kratos::EventControl,_std::allocator<kratos::EventControl>_> *local_338;
  Stmt *local_330;
  Port **local_328;
  size_type local_320;
  vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> local_318;
  v7 local_300 [32];
  string local_2e0;
  _Node_iterator_base<std::pair<kratos::Port_*const,_bool>,_false> local_2c0;
  _Node_iterator_base<std::pair<kratos::Port_*const,_bool>,_false> local_2b8;
  undefined1 local_2aa;
  allocator<const_kratos::IRNode_*> local_2a9;
  Port *local_2a8;
  vector<kratos::EventControl,_std::allocator<kratos::EventControl>_> *local_2a0;
  Port **local_298;
  size_type local_290;
  vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> local_288;
  undefined1 local_270 [16];
  undefined1 local_260 [32];
  string local_240;
  _Optional_payload_base<bool> local_21e [9];
  _Optional_payload_base<bool> local_20b;
  bool local_209;
  element_type *peStack_208;
  bool reset_high;
  element_type *port;
  shared_ptr<kratos::Port> port_s;
  Var *v;
  EventEdgeType t;
  EventControl *event;
  const_iterator __end2;
  const_iterator __begin2;
  vector<kratos::EventControl,_std::allocator<kratos::EventControl>_> *__range2;
  vector<kratos::EventControl,_std::allocator<kratos::EventControl>_> *sensitivity;
  SequentialStmtBlock *stmt_local;
  ActiveVisitor *this_local;
  pointer local_1a0;
  basic_string_view<char> local_198;
  undefined1 local_188 [56];
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*,_const_char_*>
  *vargs;
  undefined8 local_148;
  element_type *local_140;
  __node_base local_138;
  pointer local_130;
  undefined1 local_128 [16];
  basic_string_view<char> local_118;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  local_108;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_f0;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs_1;
  __node_base local_e0;
  string *local_d8;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_d0;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_c8;
  __node_base local_c0;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_b8;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_b0;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  local_a8;
  basic_string_view<char> local_98;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  local_88;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_78;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs_2;
  __node_base local_68;
  string *local_60;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_50;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_40;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_38;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_30;
  Param *local_20;
  Var *local_18;
  Param *local_10;
  
  sensitivity = (vector<kratos::EventControl,_std::allocator<kratos::EventControl>_> *)stmt;
  stmt_local = (SequentialStmtBlock *)this;
  this_00 = SequentialStmtBlock::get_event_controls(stmt);
  __end2 = std::vector<kratos::EventControl,_std::allocator<kratos::EventControl>_>::begin(this_00);
  event = (EventControl *)
          std::vector<kratos::EventControl,_std::allocator<kratos::EventControl>_>::end(this_00);
  do {
    bVar2 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_kratos::EventControl_*,_std::vector<kratos::EventControl,_std::allocator<kratos::EventControl>_>_>
                                *)&event);
    if (!bVar2) {
      return;
    }
    pEVar6 = __gnu_cxx::
             __normal_iterator<const_kratos::EventControl_*,_std::vector<kratos::EventControl,_std::allocator<kratos::EventControl>_>_>
             ::operator*(&__end2);
    EVar1 = pEVar6->edge;
    port_s.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pEVar6->var;
    VVar4 = Var::type((Var *)port_s.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi);
    if (VVar4 == PortIO) {
      Var::as<kratos::Port>((Var *)&port);
      peStack_208 = std::__shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>::get
                              ((__shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2> *)&port);
      PVar5 = Port::port_type(peStack_208);
      if (PVar5 == AsyncReset) {
        local_209 = EVar1 == Posedge;
        local_20b = (_Optional_payload_base<bool>)Port::active_high(peStack_208);
        bVar2 = std::optional::operator_cast_to_bool((optional *)&local_20b);
        if (bVar2) {
          bVar3 = local_209 & 1;
          local_21e[0] = (_Optional_payload_base<bool>)Port::active_high(peStack_208);
          pbVar7 = std::optional<bool>::operator*((optional<bool> *)local_21e);
          if (bVar3 != (*pbVar7 & 1U)) {
            local_2aa = 1;
            pVVar9 = (VarException *)__cxa_allocate_exception(0x10);
            (*(peStack_208->super_Var).super_IRNode._vptr_IRNode[0x1f])(local_260);
            local_270._0_8_ = "low";
            local_270._8_8_ = "high";
            if ((local_209 & 1U) != 0) {
              local_270._8_8_ = "low";
            }
            if ((local_209 & 1U) != 0) {
              local_270._0_8_ = "high";
            }
            local_130 = (pointer)(local_260 + 0x20);
            local_138._M_nxt = (_Hash_node_base *)0x428baa;
            local_140 = (element_type *)local_260;
            local_148 = local_270 + 8;
            vargs = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*,_const_char_*>
                     *)local_270;
            fmt::v7::make_args_checked<std::__cxx11::string,char_const*,char_const*,char[51],char>
                      ((format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*,_const_char_*>
                        *)local_188,(v7 *)"{0} is declared reset {1} but is used as reset {2}",
                       (char (*) [51])local_140,
                       (remove_reference_t<std::__cxx11::basic_string<char>_> *)local_148,
                       (remove_reference_t<const_char_*> *)vargs,
                       (remove_reference_t<const_char_*> *)in_R9.values_);
            local_188._48_8_ = local_188;
            local_198 = fmt::v7::to_string_view<char,_0>((char *)local_138._M_nxt);
            local_30._8_8_ = &this_local;
            local_30._M_allocated_capacity = local_188._48_8_;
            local_20 = (Param *)local_188._48_8_;
            local_10 = (Param *)local_188._48_8_;
            local_18 = (Var *)local_30._8_8_;
            fmt::v7::
            basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
            ::basic_format_args((basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                                 *)local_30._8_8_,0xccd,
                                (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                                 *)local_188._48_8_);
            args.
            super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
            .field_1.values_ = in_R9.values_;
            args.
            super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
            .desc_ = (unsigned_long_long)local_1a0;
            format_str_01.size_ = (size_t)this_local;
            format_str_01.data_ = (char *)local_198.size_;
            fmt::v7::detail::vformat_abi_cxx11_
                      ((string *)(local_260 + 0x20),(detail *)local_198.data_,format_str_01,args);
            local_2a8 = peStack_208;
            local_2a0 = sensitivity;
            local_298 = &local_2a8;
            local_290 = 2;
            std::allocator<const_kratos::IRNode_*>::allocator(&local_2a9);
            __l_01._M_len = local_290;
            __l_01._M_array = (iterator)local_298;
            std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
                      (&local_288,__l_01,&local_2a9);
            VarException::VarException(pVVar9,(string *)(local_260 + 0x20),&local_288);
            local_2aa = 0;
            __cxa_throw(pVVar9,&VarException::typeinfo,VarException::~VarException);
          }
        }
        local_2b8._M_cur =
             (__node_type *)
             std::
             unordered_map<kratos::Port_*,_bool,_std::hash<kratos::Port_*>,_std::equal_to<kratos::Port_*>,_std::allocator<std::pair<kratos::Port_*const,_bool>_>_>
             ::find(&this->reset_map_,&stack0xfffffffffffffdf8);
        local_2c0._M_cur =
             (__node_type *)
             std::
             unordered_map<kratos::Port_*,_bool,_std::hash<kratos::Port_*>,_std::equal_to<kratos::Port_*>,_std::allocator<std::pair<kratos::Port_*const,_bool>_>_>
             ::end(&this->reset_map_);
        bVar2 = std::__detail::operator!=(&local_2b8,&local_2c0);
        if (bVar2) {
          pmVar8 = std::
                   unordered_map<kratos::Port_*,_bool,_std::hash<kratos::Port_*>,_std::equal_to<kratos::Port_*>,_std::allocator<std::pair<kratos::Port_*const,_bool>_>_>
                   ::at(&this->reset_map_,&stack0xfffffffffffffdf8);
          in_RCX._M_cur = (__node_type *)(ulong)(local_209 & 1U);
          if ((*pmVar8 & 1U) != (local_209 & 1U)) {
            local_342 = 1;
            pVVar9 = (VarException *)__cxa_allocate_exception(0x10);
            (*(peStack_208->super_Var).super_IRNode._vptr_IRNode[0x1f])(local_300);
            local_d8 = &local_2e0;
            local_e0._M_nxt = (_Hash_node_base *)0x428bdd;
            vargs_1 = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)local_300;
            local_108.named_args.data =
                 (named_arg_info<char> *)
                 fmt::v7::make_args_checked<std::__cxx11::string,char[43],char>
                           ((format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)"Inconsistent active low/high usage for {0}",(v7 *)vargs_1,format_str
                            ,(remove_reference_t<std::__cxx11::basic_string<char>_> *)in_RCX._M_cur)
            ;
            local_f0 = &local_108;
            local_118 = fmt::v7::to_string_view<char,_0>((char *)local_e0._M_nxt);
            local_c8 = (basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                        *)local_128;
            local_d0 = local_f0;
            local_c0._M_nxt = (_Hash_node_base *)local_f0;
            local_b0 = local_f0;
            local_b8 = local_c8;
            fmt::v7::
            basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
            ::basic_format_args(local_c8,0xd,
                                (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                                 *)&local_f0->string);
            args_00.
            super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
            .field_1.values_ = in_R9.values_;
            args_00.
            super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
            .desc_ = local_128._8_8_;
            format_str_02.size_ = local_128._0_8_;
            format_str_02.data_ = (char *)local_118.size_;
            fmt::v7::detail::vformat_abi_cxx11_
                      (&local_2e0,(detail *)local_118.data_,format_str_02,args_00);
            local_340 = peStack_208;
            local_338 = sensitivity;
            local_330 = get_reset_stmt(this,peStack_208);
            local_328 = &local_340;
            local_320 = 3;
            std::allocator<const_kratos::IRNode_*>::allocator(&local_341);
            __l_00._M_len = local_320;
            __l_00._M_array = (iterator)local_328;
            std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
                      (&local_318,__l_00,&local_341);
            VarException::VarException(pVVar9,&local_2e0,&local_318);
            local_342 = 0;
            __cxa_throw(pVVar9,&VarException::typeinfo,VarException::~VarException);
          }
        }
        else {
          pVar10 = std::make_pair<kratos::Port*&,bool&>(&stack0xfffffffffffffdf8,&local_209);
          local_368 = pVar10.first;
          local_360 = pVar10.second;
          local_358.first = local_368;
          local_358.second = (bool)local_360;
          pVar11 = std::
                   unordered_map<kratos::Port*,bool,std::hash<kratos::Port*>,std::equal_to<kratos::Port*>,std::allocator<std::pair<kratos::Port*const,bool>>>
                   ::emplace<std::pair<kratos::Port*,bool>>
                             ((unordered_map<kratos::Port*,bool,std::hash<kratos::Port*>,std::equal_to<kratos::Port*>,std::allocator<std::pair<kratos::Port*const,bool>>>
                               *)&this->reset_map_,&local_358);
          local_378._M_cur =
               (__node_type *)
               pVar11.first.super__Node_iterator_base<std::pair<kratos::Port_*const,_bool>,_false>.
               _M_cur;
          local_370 = pVar11.second;
          pVar12 = std::make_pair<kratos::Port*&,kratos::SequentialStmtBlock*&>
                             (&stack0xfffffffffffffdf8,(SequentialStmtBlock **)&sensitivity);
          local_388 = pVar12;
          pVar11 = std::
                   unordered_map<kratos::Port*,bool,std::hash<kratos::Port*>,std::equal_to<kratos::Port*>,std::allocator<std::pair<kratos::Port*const,bool>>>
                   ::emplace<std::pair<kratos::Port*,kratos::SequentialStmtBlock*>>
                             ((unordered_map<kratos::Port*,bool,std::hash<kratos::Port*>,std::equal_to<kratos::Port*>,std::allocator<std::pair<kratos::Port*const,bool>>>
                               *)&this->reset_map_,&local_388);
          in_RCX._M_cur =
               (__node_type *)
               pVar11.first.super__Node_iterator_base<std::pair<kratos::Port_*const,_bool>,_false>.
               _M_cur;
          local_390 = pVar11.second;
          local_398._M_cur = in_RCX._M_cur;
        }
      }
      else {
        PVar5 = Port::port_type(peStack_208);
        if (PVar5 == Reset) {
          pVVar9 = (VarException *)__cxa_allocate_exception(0x10);
          (*(peStack_208->super_Var).super_IRNode._vptr_IRNode[0x1f])(local_3d8);
          local_60 = &local_3b8;
          local_68._M_nxt = (_Hash_node_base *)0x428c08;
          vargs_2 = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)local_3d8;
          local_88.named_args.data =
               (named_arg_info<char> *)
               fmt::v7::make_args_checked<std::__cxx11::string,char[55],char>
                         ((format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)"{0} is used as async reset but is declared synchronous",(v7 *)vargs_2,
                          format_str_00,
                          (remove_reference_t<std::__cxx11::basic_string<char>_> *)in_RCX._M_cur);
          local_78 = &local_88;
          local_98 = fmt::v7::to_string_view<char,_0>((char *)local_68._M_nxt);
          local_50._M_allocated_capacity = (size_type)&local_a8;
          local_58 = local_78;
          local_50._8_8_ = local_78;
          local_38 = local_78;
          local_40 = (basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                      *)local_50._M_allocated_capacity;
          fmt::v7::
          basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          ::basic_format_args((basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                               *)local_50._M_allocated_capacity,0xd,
                              (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                               *)&local_78->string);
          args_01.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .field_1.values_ = in_R9.values_;
          args_01.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .desc_ = (unsigned_long_long)local_a8.field_1.values_;
          format_str_03.size_ = local_a8.desc_;
          format_str_03.data_ = (char *)local_98.size_;
          fmt::v7::detail::vformat_abi_cxx11_
                    (&local_3b8,(detail *)local_98.data_,format_str_03,args_01);
          local_410 = peStack_208;
          local_408 = sensitivity;
          local_400 = &local_410;
          local_3f8 = 2;
          std::allocator<const_kratos::IRNode_*>::allocator(&local_411);
          __l._M_len = local_3f8;
          __l._M_array = (iterator)local_400;
          std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
                    (&local_3f0,__l,&local_411);
          VarException::VarException(pVVar9,&local_3b8,&local_3f0);
          __cxa_throw(pVVar9,&VarException::typeinfo,VarException::~VarException);
        }
      }
      std::shared_ptr<kratos::Port>::~shared_ptr((shared_ptr<kratos::Port> *)&port);
    }
    __gnu_cxx::
    __normal_iterator<const_kratos::EventControl_*,_std::vector<kratos::EventControl,_std::allocator<kratos::EventControl>_>_>
    ::operator++(&__end2);
  } while( true );
}

Assistant:

void visit(SequentialStmtBlock* stmt) override {
        auto const& sensitivity = stmt->get_event_controls();
        for (auto const& event : sensitivity) {
            auto t = event.edge;
            auto* v = event.var;
            if (v->type() == VarType::PortIO) {
                auto port_s = v->as<Port>();
                auto* port = port_s.get();
                if (port->port_type() == PortType::AsyncReset) {
                    auto reset_high = t == EventEdgeType::Posedge;
                    // check if we have reset edge set
                    if (port->active_high()) {
                        if (reset_high != (*port->active_high())) {
                            throw VarException(
                                ::format("{0} is declared reset {1} but is used as reset {2}",
                                         port->to_string(), reset_high ? "low" : "high",
                                         reset_high ? "high" : "low"),
                                {port, stmt});
                        }
                    }
                    if (reset_map_.find(port) != reset_map_.end()) {
                        // check consistency
                        if (reset_map_.at(port) != reset_high) {
                            throw VarException(
                                ::format("Inconsistent active low/high usage for {0}",
                                         port->to_string()),
                                {port, stmt, get_reset_stmt(port)});
                        }
                    } else {
                        reset_map_.emplace(std::make_pair(port, reset_high));
                        reset_map_.emplace(std::make_pair(port, stmt));
                    }
                } else if (port->port_type() == PortType::Reset) {
                    throw VarException(
                        ::format("{0} is used as async reset but is declared synchronous",
                                 port->to_string()),
                        {port, stmt});
                }
            }
        }
    }